

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void Am_Text_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  bool bVar1;
  Am_Value_Type AVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  int src_y;
  int y;
  int x;
  Am_Inter_Location data;
  Am_Object owner;
  Am_Object command_obj;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Inter_Internal_Method inter_method;
  
  pAVar4 = Am_Object::Get(inter,300,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 == 1) {
    bVar1 = true;
  }
  else {
    if (iVar3 != 0) goto LAB_001c84b1;
    bVar1 = false;
  }
  Am_Object::Set(inter,0x11c,bVar1,0);
LAB_001c84b1:
  Am_Object::Set(inter,300,3,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(object);
  Am_Object::Set(inter,0x16d,pAVar5,0);
  bVar1 = Am_Check_Inter_Abort_Inactive_Object(object,0x15c,inter);
  if (bVar1) {
    inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
    inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(&Am_Interactor,0xbe,0);
    Am_Inter_Internal_Method::operator=(&inter_method,pAVar4);
    (*inter_method.Call)(inter,object,event_window,ev);
    command_obj.data = (Am_Object_Data *)0x0;
    pAVar4 = Am_Object::Get(inter,0xc5,0);
    Am_Object::operator=(&command_obj,pAVar4);
    set_initial_text_values(inter,&command_obj,object,ev->x,ev->y);
    Am_Inter_Location::Am_Inter_Location(&data,&Am_No_Location);
    iVar3 = ev->x;
    src_y = ev->y;
    y = src_y;
    x = iVar3;
    Am_Object::Am_Object(&local_50,&Am_Text_Create_Interactor);
    bVar1 = Am_Object::Is_Instance_Of(inter,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      AVar2 = Am_Object::Get_Slot_Type(inter,0x16a,0);
      if ((AVar2 & 0x7000) == 0x2000) {
        Am_Object::Make_Unique(inter,0x16a);
        pAVar4 = Am_Object::Get(inter,0x16a,0);
        Am_Inter_Location::operator=(&data,pAVar4);
      }
      else {
        Am_Object::Am_Object(&local_58,&Am_No_Object);
        Am_Inter_Location::Set_Location(&data,false,&local_58,0,0,0,0,true);
        Am_Object::~Am_Object(&local_58);
        pAVar5 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&data);
        Am_Object::Set(inter,0x16a,pAVar5,0);
      }
      Am_Object::Get_Owner(&owner,(Am_Slot_Flags)inter);
      bVar1 = Am_Object::Valid(&owner);
      if (bVar1) {
        Am_Translate_Coordinates(event_window,iVar3,src_y,&owner,&x,&y);
      }
      else {
        Am_Object::operator=(&owner,event_window);
      }
      Am_Object::Am_Object(&local_60,inter);
      Am_Get_Filtered_Input(&local_60,&owner,x,y,&x,&y);
      Am_Object::~Am_Object(&local_60);
      Am_Object::Am_Object(&local_68,&owner);
      Am_Inter_Location::Set_Location(&data,false,&local_68,x,y,0,0,false);
      Am_Object::~Am_Object(&local_68);
      Am_Inter_Location::Set_Growing(&data,false,true);
      Am_Object::~Am_Object(&owner);
      iVar3 = x;
      src_y = y;
    }
    Am_Inter_Call_Both_Method
              (inter,&command_obj,199,iVar3,src_y,event_window,&ev->input_char,object,&data);
    Am_Inter_Location::~Am_Inter_Location(&data);
    Am_Object::~Am_Object(&command_obj);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Text_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Text starting over " << object);

  // in case last time ran, stopped because pressed outside
  int real_run = inter.Get(Am_REAL_RUN_ALSO);
  if (real_run == 1)
    inter.Set(Am_RUN_ALSO, true);
  else if (real_run == 0)
    inter.Set(Am_RUN_ALSO, false);
  inter.Set(Am_REAL_RUN_ALSO, 3);

  inter.Set(Am_OBJECT_MODIFIED, object);
  //do this before prototype's method, so won't even change state
  if (!Am_Check_Inter_Abort_Inactive_Object(object, Am_TEXT_EDIT_INACTIVE,
                                            inter))
    return;

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  set_initial_text_values(inter, command_obj, object, ev->x, ev->y);

  Am_Inter_Location data = Am_No_Location;
  int x = ev->x;
  int y = ev->y;
  if (inter.Is_Instance_Of(Am_Text_Create_Interactor)) {
    if (Am_Type_Class(inter.Get_Slot_Type(Am_INTERIM_VALUE)) == Am_WRAPPER) {
      inter.Make_Unique(Am_INTERIM_VALUE);
      data = inter.Get(Am_INTERIM_VALUE);
    } else {
      //set up with some temporary values
      data.Set_Location(false, Am_No_Object, 0, 0, 0, 0);
      inter.Set(Am_INTERIM_VALUE, data);
    }
    Am_Object owner = inter.Get_Owner();
    if (owner.Valid()) {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                           "Translating coordinates from " << event_window
                                                           << " to " << owner);
      Am_Translate_Coordinates(event_window, x, y, owner, x, y);
    } else
      owner = event_window;
    Am_Get_Filtered_Input(inter, owner, x, y, x, y);
    data.Set_Location(false, owner, x, y, 0, 0, false);
    data.Set_Growing(false);
  }
  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ev->input_char, object, data);
}